

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pResultSet,u16 wctrlFlags,int iAuxArg)

{
  byte bVar1;
  uint uVar2;
  Vdbe *p;
  sqlite3 *db_00;
  WhereLoop *pWVar3;
  Table *pTab_00;
  Index *pIdx;
  u8 uVar4;
  int iVar5;
  int iVar6;
  WhereMaskSet *pMaskSet_00;
  u8 *puVar7;
  Bitmask BVar8;
  WhereTerm *pWVar9;
  VTable *zP4;
  WhereLevel *pLevel_00;
  bool bVar10;
  int local_15c;
  int wsFlags_1;
  int addrExplain;
  Index *pJ;
  int op_1;
  int iIndexCur;
  Index *pIx;
  Bitmask BStack_130;
  int n;
  Bitmask b;
  int op;
  int iCur;
  char *pVTab;
  SrcList_item *pTabItem;
  int iDb;
  Table *pTab;
  int bOnerow;
  int wsFlags;
  int nByte;
  SrcList_item *pItem;
  WhereTerm *pEnd;
  WhereTerm *pTerm;
  Bitmask tabUsed;
  int i;
  WhereTerm *pT;
  u8 bFordelete;
  int rc;
  sqlite3 *db;
  int ii;
  WhereLoop *pLoop;
  WhereLevel *pLevel;
  WhereMaskSet *pMaskSet;
  WhereLoopBuilder sWLB;
  Bitmask notReady;
  Vdbe *v;
  WhereInfo *pWInfo;
  int nTabList;
  int nByteWInfo;
  u16 wctrlFlags_local;
  ExprList *pResultSet_local;
  ExprList *pOrderBy_local;
  Expr *pWhere_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  pT._3_1_ = 0;
  db_00 = pParse->db;
  memset(&pMaskSet,0,0x30);
  pResultSet_local = pOrderBy;
  if ((pOrderBy != (ExprList *)0x0) && (0x3f < pOrderBy->nExpr)) {
    pResultSet_local = (ExprList *)0x0;
  }
  sWLB.pWC = (WhereClause *)pResultSet_local;
  nTabList._2_2_ = wctrlFlags;
  if ((db_00->dbOptFlags & 0x10) != 0) {
    nTabList._2_2_ = wctrlFlags & 0xfeff;
  }
  if (pTabList->nSrc < 0x41) {
    if ((nTabList._2_2_ & 0x20) == 0) {
      local_15c = pTabList->nSrc;
    }
    else {
      local_15c = 1;
    }
    pWInfo._4_4_ = local_15c;
    iVar5 = (local_15c + -1) * 0x58 + 0x3f0;
    v = (Vdbe *)sqlite3DbMallocRawNN(db_00,(long)iVar5 + 0x60);
    if (db_00->mallocFailed == '\0') {
      ((WhereInfo *)v)->pParse = pParse;
      ((WhereInfo *)v)->pTabList = pTabList;
      ((WhereInfo *)v)->pOrderBy = pResultSet_local;
      ((WhereInfo *)v)->pWhere = pWhere;
      ((WhereInfo *)v)->pResultSet = pResultSet;
      ((WhereInfo *)v)->aiCurOnePass[1] = -1;
      ((WhereInfo *)v)->aiCurOnePass[0] = -1;
      ((WhereInfo *)v)->nLevel = (u8)local_15c;
      iVar6 = sqlite3VdbeMakeLabel(pParse);
      ((WhereInfo *)v)->iContinue = iVar6;
      ((WhereInfo *)v)->iBreak = iVar6;
      ((WhereInfo *)v)->wctrlFlags = nTabList._2_2_;
      ((WhereInfo *)v)->iLimit = (LogEst)iAuxArg;
      ((WhereInfo *)v)->savedNQueryLoop = pParse->nQueryLoop;
      memset(&((WhereInfo *)v)->nOBSat,0,0x25);
      memset(((WhereInfo *)v)->a,0,(long)local_15c * 0x58 + 0x60);
      pMaskSet_00 = &((WhereInfo *)v)->sMaskSet;
      sWLB.pWInfo = (WhereInfo *)&((WhereInfo *)v)->sWC;
      sWLB.pOrderBy = (ExprList *)((long)((WhereInfo *)v)->aiCurOnePass + (long)iVar5 + -0x2c);
      pMaskSet = (WhereMaskSet *)v;
      whereLoopInit((WhereLoop *)sWLB.pOrderBy);
      (((WhereInfo *)v)->sMaskSet).n = 0;
      sqlite3WhereClauseInit(&((WhereInfo *)v)->sWC,(WhereInfo *)v);
      sqlite3WhereSplit(&((WhereInfo *)v)->sWC,pWhere,',');
      if (local_15c == 0) {
        if (pResultSet_local != (ExprList *)0x0) {
          ((WhereInfo *)v)->nOBSat = (i8)pResultSet_local->nExpr;
        }
        if ((nTabList._2_2_ & 0x100) != 0) {
          ((WhereInfo *)v)->eDistinct = '\x01';
        }
        sqlite3VdbeExplain(pParse,'\0',"SCAN CONSTANT ROW");
      }
      else {
        db._4_4_ = 0;
        do {
          createMask(pMaskSet_00,pTabList->a[db._4_4_].iCursor);
          sqlite3WhereTabFuncArgs(pParse,pTabList->a + db._4_4_,&((WhereInfo *)v)->sWC);
          db._4_4_ = db._4_4_ + 1;
        } while (db._4_4_ < pTabList->nSrc);
      }
      sqlite3WhereExprAnalyze(pTabList,&((WhereInfo *)v)->sWC);
      if (db_00->mallocFailed == '\0') {
        for (db._4_4_ = 0; db._4_4_ < *(int *)((long)&(sWLB.pWInfo)->pOrderBy + 4);
            db._4_4_ = db._4_4_ + 1) {
          puVar7 = &(sWLB.pWInfo)->pWhere->op + (long)db._4_4_ * 0x40;
          if ((((*(ushort *)(puVar7 + 0x12) & 2) == 0) &&
              (*(AggInfo **)(puVar7 + 0x38) == (AggInfo *)0x0)) &&
             ((local_15c == 0 || (iVar5 = exprIsDeterministic(*(Expr **)puVar7), iVar5 != 0)))) {
            sqlite3ExprIfFalse(pParse,*(Expr **)puVar7,((WhereInfo *)v)->iBreak,0x10);
            *(ushort *)(puVar7 + 0x12) = *(ushort *)(puVar7 + 0x12) | 4;
          }
        }
        if ((nTabList._2_2_ & 0x100) != 0) {
          iVar5 = isDistinctRedundant(pParse,pTabList,&((WhereInfo *)v)->sWC,pResultSet);
          if (iVar5 == 0) {
            if (pResultSet_local == (ExprList *)0x0) {
              ((WhereInfo *)v)->wctrlFlags = ((WhereInfo *)v)->wctrlFlags | 0x80;
              ((WhereInfo *)v)->pOrderBy = pResultSet;
            }
          }
          else {
            ((WhereInfo *)v)->eDistinct = '\x01';
          }
        }
        if (((local_15c == 1) && (iVar5 = whereShortCut((WhereLoopBuilder *)&pMaskSet), iVar5 != 0))
           || (((iVar5 = whereLoopAddAll((WhereLoopBuilder *)&pMaskSet), iVar5 == 0 &&
                (wherePathSolver((WhereInfo *)v,0), db_00->mallocFailed == '\0')) &&
               ((((WhereInfo *)v)->pOrderBy == (ExprList *)0x0 ||
                (wherePathSolver((WhereInfo *)v,((WhereInfo *)v)->nRowOut + 1),
                db_00->mallocFailed == '\0')))))) {
          if ((((WhereInfo *)v)->pOrderBy == (ExprList *)0x0) && ((db_00->flags & 0x1000) != 0)) {
            ((WhereInfo *)v)->revMask = 0xffffffffffffffff;
          }
          if ((pParse->nErr == 0) && (db_00->mallocFailed == '\0')) {
            sWLB.bldFlags = 0xffffffff;
            sWLB.iPlanLimit = 0xffffffff;
            if ((1 < ((WhereInfo *)v)->nLevel) &&
               ((pResultSet != (ExprList *)0x0 && ((db_00->dbOptFlags & 0x100) == 0)))) {
              pTerm = (WhereTerm *)sqlite3WhereExprListUsage(pMaskSet_00,pResultSet);
              if (sWLB.pWC != (WhereClause *)0x0) {
                BVar8 = sqlite3WhereExprListUsage(pMaskSet_00,(ExprList *)sWLB.pWC);
                pTerm = (WhereTerm *)(BVar8 | (ulong)pTerm);
              }
              tabUsed._4_4_ = (uint)((WhereInfo *)v)->nLevel;
              while (uVar2 = tabUsed._4_4_, tabUsed._4_4_ = uVar2 - 1, 0 < (int)tabUsed._4_4_) {
                pWVar3 = ((WhereInfo *)v)->a[(int)tabUsed._4_4_].pWLoop;
                if (((((WhereInfo *)v)->pTabList->a[pWVar3->iTab].fg.jointype & 8) != 0) &&
                   ((((nTabList._2_2_ & 0x100) != 0 || ((pWVar3->wsFlags & 0x1000) != 0)) &&
                    (((ulong)pTerm & pWVar3->maskSelf) == 0)))) {
                  pWVar9 = (WhereTerm *)
                           (&(sWLB.pWInfo)->pWhere->op +
                           (long)*(int *)((long)&(sWLB.pWInfo)->pOrderBy + 4) * 0x40);
                  pEnd = (WhereTerm *)(sWLB.pWInfo)->pWhere;
                  while ((pEnd < pWVar9 &&
                         (((pEnd->prereqAll & pWVar3->maskSelf) == 0 ||
                          (((pEnd->pExpr->flags & 1) != 0 &&
                           ((int)pEnd->pExpr->iRightJoinTable ==
                            ((WhereInfo *)v)->pTabList->a[pWVar3->iTab].iCursor))))))) {
                    pEnd = pEnd + 1;
                  }
                  if (pWVar9 <= pEnd) {
                    sWLB._40_8_ = (pWVar3->maskSelf ^ 0xffffffffffffffff) & sWLB._40_8_;
                    for (pEnd = (WhereTerm *)(sWLB.pWInfo)->pWhere; pEnd < pWVar9; pEnd = pEnd + 1)
                    {
                      if ((pEnd->prereqAll & pWVar3->maskSelf) != 0) {
                        pEnd->wtFlags = pEnd->wtFlags | 4;
                      }
                    }
                    if (tabUsed._4_4_ != ((WhereInfo *)v)->nLevel - 1) {
                      memmove(((WhereInfo *)v)->a + (int)tabUsed._4_4_,
                              ((WhereInfo *)v)->a + (int)uVar2,
                              (long)(int)(((((WhereInfo *)v)->nLevel - 1) - tabUsed._4_4_) * 0x58));
                    }
                    ((WhereInfo *)v)->nLevel = ((WhereInfo *)v)->nLevel + 0xff;
                    pWInfo._4_4_ = pWInfo._4_4_ + -1;
                  }
                }
              }
            }
            ((WhereInfo *)v)->pParse->nQueryLoop =
                 (int)((WhereInfo *)v)->nRowOut + ((WhereInfo *)v)->pParse->nQueryLoop;
            if ((nTabList._2_2_ & 4) != 0) {
              uVar2 = (((WhereInfo *)v)->a[0].pWLoop)->wsFlags;
              bVar10 = (uVar2 & 0x1000) != 0;
              if ((bVar10) ||
                 ((((nTabList._2_2_ & 8) != 0 && ((pTabList->a[0].pTab)->nModuleArg == 0)) &&
                  (((uVar2 & 0x2000) == 0 || ((nTabList._2_2_ & 0x10) != 0)))))) {
                uVar4 = '\x02';
                if (bVar10) {
                  uVar4 = '\x01';
                }
                ((WhereInfo *)v)->eOnePass = uVar4;
                if ((((pTabList->a[0].pTab)->tabFlags & 0x20) == 0) && ((uVar2 & 0x40) != 0)) {
                  if ((nTabList._2_2_ & 8) != 0) {
                    pT._3_1_ = 8;
                  }
                  (((WhereInfo *)v)->a[0].pWLoop)->wsFlags = uVar2 & 0xffffffbf;
                }
              }
            }
            pLoop = (WhereLoop *)((WhereInfo *)v)->a;
            for (db._4_4_ = 0; db._4_4_ < pWInfo._4_4_; db._4_4_ = db._4_4_ + 1) {
              bVar1 = (byte)pLoop->nLTerm;
              pTab_00 = pTabList->a[bVar1].pTab;
              iVar5 = sqlite3SchemaToIndex(db_00,pTab_00->pSchema);
              pWVar9 = pLoop->aLTermSpace[0];
              if (((pTab_00->tabFlags & 2) == 0) && (pTab_00->pSelect == (Select *)0x0)) {
                if (((pWVar9->u).leftColumn & 0x400U) == 0) {
                  if (pTab_00->nModuleArg == 0) {
                    if ((((pWVar9->u).leftColumn & 0x40U) == 0) && ((nTabList._2_2_ & 0x20) == 0)) {
                      b._0_4_ = 0x6c;
                      if (((WhereInfo *)v)->eOnePass != '\0') {
                        b._0_4_ = 0x6d;
                        ((WhereInfo *)v)->aiCurOnePass[0] = pTabList->a[bVar1].iCursor;
                      }
                      sqlite3OpenTable(pParse,pTabList->a[bVar1].iCursor,iVar5,pTab_00,(int)b);
                      if (((((WhereInfo *)v)->eOnePass == '\0') && (pTab_00->nCol < 0x40)) &&
                         ((pTab_00->tabFlags & 0x20) == 0)) {
                        BStack_130 = pTabList->a[bVar1].colUsed;
                        pIx._4_4_ = 0;
                        for (; BStack_130 != 0; BStack_130 = BStack_130 >> 1) {
                          pIx._4_4_ = pIx._4_4_ + 1;
                        }
                        sqlite3VdbeChangeP4(p,-1,(char *)(long)pIx._4_4_,-3);
                      }
                      sqlite3VdbeChangeP5(p,(ushort)pT._3_1_);
                    }
                    else {
                      sqlite3TableLock(pParse,iVar5,pTab_00->tnum,'\0',pTab_00->zName);
                    }
                  }
                }
                else {
                  zP4 = sqlite3GetVTable(db_00,pTab_00);
                  sqlite3VdbeAddOp4(p,0xa3,pTabList->a[bVar1].iCursor,0,0,(char *)zP4,-0xc);
                }
              }
              if (((pWVar9->u).leftColumn & 0x200U) != 0) {
                pIdx = *(Index **)&pWVar9->iField;
                pJ._0_4_ = 0x6c;
                if ((((pTab_00->tabFlags & 0x20) == 0) || ((*(ushort *)&pIdx->field_0x63 & 3) != 2))
                   || ((nTabList._2_2_ & 0x20) == 0)) {
                  if (((WhereInfo *)v)->eOnePass == '\0') {
                    if ((iAuxArg == 0) || ((nTabList._2_2_ & 0x20) == 0)) {
                      pJ._4_4_ = pParse->nTab;
                      pParse->nTab = pJ._4_4_ + 1;
                    }
                    else {
                      pJ._4_4_ = iAuxArg;
                      pJ._0_4_ = 0x6a;
                    }
                  }
                  else {
                    _wsFlags_1 = (pTabList->a[bVar1].pTab)->pIndex;
                    pJ._4_4_ = iAuxArg;
                    for (; _wsFlags_1 != (Index *)0x0 && _wsFlags_1 != pIdx;
                        _wsFlags_1 = _wsFlags_1->pNext) {
                      pJ._4_4_ = pJ._4_4_ + 1;
                    }
                    pJ._0_4_ = 0x6d;
                    ((WhereInfo *)v)->aiCurOnePass[1] = pJ._4_4_;
                  }
                }
                else {
                  pJ._4_4_ = *(int *)((long)&pLoop->prereq + 4);
                  pJ._0_4_ = 0;
                }
                *(int *)&pLoop->maskSelf = pJ._4_4_;
                if ((int)pJ != 0) {
                  sqlite3VdbeAddOp3(p,(int)pJ,pJ._4_4_,pIdx->tnum,iVar5);
                  sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
                  if ((((((pWVar9->u).leftColumn & 0xfU) != 0) &&
                       (((pWVar9->u).leftColumn & 0x8002U) == 0)) &&
                      ((((WhereInfo *)v)->wctrlFlags & 1) == 0)) &&
                     (((WhereInfo *)v)->eDistinct != '\x02')) {
                    sqlite3VdbeChangeP5(p,2);
                  }
                }
              }
              if (-1 < iVar5) {
                sqlite3CodeVerifySchema(pParse,iVar5);
              }
              pLoop = (WhereLoop *)(pLoop->aLTermSpace + 2);
            }
            iVar5 = sqlite3VdbeCurrentAddr(p);
            ((WhereInfo *)v)->iTop = iVar5;
            if (db_00->mallocFailed == '\0') {
              db._4_4_ = 0;
              while( true ) {
                if (pWInfo._4_4_ <= db._4_4_) {
                  return (WhereInfo *)v;
                }
                pLevel_00 = ((WhereInfo *)v)->a + db._4_4_;
                if (((pLevel_00->pWLoop->wsFlags & 0x4000) != 0) &&
                   (constructAutomaticIndex
                              (pParse,&((WhereInfo *)v)->sWC,pTabList->a + pLevel_00->iFrom,
                               sWLB._40_8_,pLevel_00), db_00->mallocFailed != '\0')) break;
                sqlite3WhereExplainOneScan(pParse,pTabList,pLevel_00,nTabList._2_2_);
                iVar5 = sqlite3VdbeCurrentAddr(p);
                pLevel_00->addrBody = iVar5;
                sWLB._40_8_ = sqlite3WhereCodeOneLoopStart
                                        (pParse,p,(WhereInfo *)v,db._4_4_,pLevel_00,sWLB._40_8_);
                ((WhereInfo *)v)->iContinue = pLevel_00->addrCont;
                db._4_4_ = db._4_4_ + 1;
              }
            }
          }
        }
      }
    }
    else {
      sqlite3DbFree(db_00,v);
      v = (Vdbe *)0x0;
    }
    if (v != (Vdbe *)0x0) {
      pParse->nQueryLoop = v->nChange;
      whereInfoFree(db_00,(WhereInfo *)v);
    }
  }
  else {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
  }
  return (WhereInfo *)0x0;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,          /* The parser context */
  SrcList *pTabList,      /* FROM clause: A list of all tables to be scanned */
  Expr *pWhere,           /* The WHERE clause */
  ExprList *pOrderBy,     /* An ORDER BY (or GROUP BY) clause, or NULL */
  ExprList *pResultSet,   /* Query result set.  Req'd for DISTINCT */
  u16 wctrlFlags,         /* The WHERE_* flags defined in sqliteInt.h */
  int iAuxArg             /* If WHERE_OR_SUBCLAUSE is set, index cursor number
                          ** If WHERE_USE_LIMIT, then the limit amount */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereLoopBuilder sWLB;     /* The WhereLoop builder */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  WhereLoop *pLoop;          /* Pointer to a single WhereLoop object */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */
  int rc;                    /* Return code */
  u8 bFordelete = 0;         /* OPFLAG_FORDELETE or zero, as appropriate */

  assert( (wctrlFlags & WHERE_ONEPASS_MULTIROW)==0 || (
        (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 
     && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0 
  ));

  /* Only one of WHERE_OR_SUBCLAUSE or WHERE_USE_LIMIT */
  assert( (wctrlFlags & WHERE_OR_SUBCLAUSE)==0
            || (wctrlFlags & WHERE_USE_LIMIT)==0 );

  /* Variable initialization */
  db = pParse->db;
  memset(&sWLB, 0, sizeof(sWLB));

  /* An ORDER/GROUP BY clause of more than 63 terms cannot be optimized */
  testcase( pOrderBy && pOrderBy->nExpr==BMS-1 );
  if( pOrderBy && pOrderBy->nExpr>=BMS ) pOrderBy = 0;
  sWLB.pOrderBy = pOrderBy;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ){
    wctrlFlags &= ~WHERE_WANT_DISTINCT;
  }

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_OR_SUBCLAUSE flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_OR_SUBCLAUSE) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocRawNN(db, nByteWInfo + sizeof(WhereLoop));
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->pOrderBy = pOrderBy;
  pWInfo->pWhere = pWhere;
  pWInfo->pResultSet = pResultSet;
  pWInfo->aiCurOnePass[0] = pWInfo->aiCurOnePass[1] = -1;
  pWInfo->nLevel = nTabList;
  pWInfo->iBreak = pWInfo->iContinue = sqlite3VdbeMakeLabel(pParse);
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->iLimit = iAuxArg;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  memset(&pWInfo->nOBSat, 0, 
         offsetof(WhereInfo,sWC) - offsetof(WhereInfo,nOBSat));
  memset(&pWInfo->a[0], 0, sizeof(WhereLoop)+nTabList*sizeof(WhereLevel));
  assert( pWInfo->eOnePass==ONEPASS_OFF );  /* ONEPASS defaults to OFF */
  pMaskSet = &pWInfo->sMaskSet;
  sWLB.pWInfo = pWInfo;
  sWLB.pWC = &pWInfo->sWC;
  sWLB.pNew = (WhereLoop*)(((char*)pWInfo)+nByteWInfo);
  assert( EIGHT_BYTE_ALIGNMENT(sWLB.pNew) );
  whereLoopInit(sWLB.pNew);
#ifdef SQLITE_DEBUG
  sWLB.pNew->cId = '*';
#endif

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  sqlite3WhereClauseInit(&pWInfo->sWC, pWInfo);
  sqlite3WhereSplit(&pWInfo->sWC, pWhere, TK_AND);
    
  /* Special case: No FROM clause
  */
  if( nTabList==0 ){
    if( pOrderBy ) pWInfo->nOBSat = pOrderBy->nExpr;
    if( wctrlFlags & WHERE_WANT_DISTINCT ){
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }
    ExplainQueryPlan((pParse, 0, "SCAN CONSTANT ROW"));
  }else{
    /* Assign a bit from the bitmask to every term in the FROM clause.
    **
    ** The N-th term of the FROM clause is assigned a bitmask of 1<<N.
    **
    ** The rule of the previous sentence ensures thta if X is the bitmask for
    ** a table T, then X-1 is the bitmask for all other tables to the left of T.
    ** Knowing the bitmask for all tables to the left of a left join is
    ** important.  Ticket #3015.
    **
    ** Note that bitmasks are created for all pTabList->nSrc tables in
    ** pTabList, not just the first nTabList tables.  nTabList is normally
    ** equal to pTabList->nSrc but might be shortened to 1 if the
    ** WHERE_OR_SUBCLAUSE flag is set.
    */
    ii = 0;
    do{
      createMask(pMaskSet, pTabList->a[ii].iCursor);
      sqlite3WhereTabFuncArgs(pParse, &pTabList->a[ii], &pWInfo->sWC);
    }while( (++ii)<pTabList->nSrc );
  #ifdef SQLITE_DEBUG
    {
      Bitmask mx = 0;
      for(ii=0; ii<pTabList->nSrc; ii++){
        Bitmask m = sqlite3WhereGetMask(pMaskSet, pTabList->a[ii].iCursor);
        assert( m>=mx );
        mx = m;
      }
    }
  #endif
  }
  
  /* Analyze all of the subexpressions. */
  sqlite3WhereExprAnalyze(pTabList, &pWInfo->sWC);
  if( db->mallocFailed ) goto whereBeginError;

  /* Special case: WHERE terms that do not refer to any tables in the join
  ** (constant expressions). Evaluate each such term, and jump over all the
  ** generated code if the result is not true.  
  **
  ** Do not do this if the expression contains non-deterministic functions
  ** that are not within a sub-select. This is not strictly required, but
  ** preserves SQLite's legacy behaviour in the following two cases:
  **
  **   FROM ... WHERE random()>0;           -- eval random() once per row
  **   FROM ... WHERE (SELECT random())>0;  -- eval random() once overall
  */
  for(ii=0; ii<sWLB.pWC->nTerm; ii++){
    WhereTerm *pT = &sWLB.pWC->a[ii];
    if( pT->wtFlags & TERM_VIRTUAL ) continue;
    if( pT->prereqAll==0 && (nTabList==0 || exprIsDeterministic(pT->pExpr)) ){
      sqlite3ExprIfFalse(pParse, pT->pExpr, pWInfo->iBreak, SQLITE_JUMPIFNULL);
      pT->wtFlags |= TERM_CODED;
    }
  }

  if( wctrlFlags & WHERE_WANT_DISTINCT ){
    if( isDistinctRedundant(pParse, pTabList, &pWInfo->sWC, pResultSet) ){
      /* The DISTINCT marking is pointless.  Ignore it. */
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }else if( pOrderBy==0 ){
      /* Try to ORDER BY the result set to make distinct processing easier */
      pWInfo->wctrlFlags |= WHERE_DISTINCTBY;
      pWInfo->pOrderBy = pResultSet;
    }
  }

  /* Construct the WhereLoop objects */
#if defined(WHERETRACE_ENABLED)
  if( sqlite3WhereTrace & 0xffff ){
    sqlite3DebugPrintf("*** Optimizer Start *** (wctrlFlags: 0x%x",wctrlFlags);
    if( wctrlFlags & WHERE_USE_LIMIT ){
      sqlite3DebugPrintf(", limit: %d", iAuxArg);
    }
    sqlite3DebugPrintf(")\n");
  }
  if( sqlite3WhereTrace & 0x100 ){ /* Display all terms of the WHERE clause */
    sqlite3WhereClausePrint(sWLB.pWC);
  }
#endif

  if( nTabList!=1 || whereShortCut(&sWLB)==0 ){
    rc = whereLoopAddAll(&sWLB);
    if( rc ) goto whereBeginError;
  
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace ){    /* Display all of the WhereLoop objects */
      WhereLoop *p;
      int i;
      static const char zLabel[] = "0123456789abcdefghijklmnopqrstuvwyxz"
                                             "ABCDEFGHIJKLMNOPQRSTUVWYXZ";
      for(p=pWInfo->pLoops, i=0; p; p=p->pNextLoop, i++){
        p->cId = zLabel[i%(sizeof(zLabel)-1)];
        whereLoopPrint(p, sWLB.pWC);
      }
    }
#endif
  
    wherePathSolver(pWInfo, 0);
    if( db->mallocFailed ) goto whereBeginError;
    if( pWInfo->pOrderBy ){
       wherePathSolver(pWInfo, pWInfo->nRowOut+1);
       if( db->mallocFailed ) goto whereBeginError;
    }
  }
  if( pWInfo->pOrderBy==0 && (db->flags & SQLITE_ReverseOrder)!=0 ){
     pWInfo->revMask = ALLBITS;
  }
  if( pParse->nErr || NEVER(db->mallocFailed) ){
    goto whereBeginError;
  }
#ifdef WHERETRACE_ENABLED
  if( sqlite3WhereTrace ){
    sqlite3DebugPrintf("---- Solution nRow=%d", pWInfo->nRowOut);
    if( pWInfo->nOBSat>0 ){
      sqlite3DebugPrintf(" ORDERBY=%d,0x%llx", pWInfo->nOBSat, pWInfo->revMask);
    }
    switch( pWInfo->eDistinct ){
      case WHERE_DISTINCT_UNIQUE: {
        sqlite3DebugPrintf("  DISTINCT=unique");
        break;
      }
      case WHERE_DISTINCT_ORDERED: {
        sqlite3DebugPrintf("  DISTINCT=ordered");
        break;
      }
      case WHERE_DISTINCT_UNORDERED: {
        sqlite3DebugPrintf("  DISTINCT=unordered");
        break;
      }
    }
    sqlite3DebugPrintf("\n");
    for(ii=0; ii<pWInfo->nLevel; ii++){
      whereLoopPrint(pWInfo->a[ii].pWLoop, sWLB.pWC);
    }
  }
#endif

  /* Attempt to omit tables from the join that do not affect the result.
  ** For a table to not affect the result, the following must be true:
  **
  **   1) The query must not be an aggregate.
  **   2) The table must be the RHS of a LEFT JOIN.
  **   3) Either the query must be DISTINCT, or else the ON or USING clause
  **      must contain a constraint that limits the scan of the table to 
  **      at most a single row.
  **   4) The table must not be referenced by any part of the query apart
  **      from its own USING or ON clause.
  **
  ** For example, given:
  **
  **     CREATE TABLE t1(ipk INTEGER PRIMARY KEY, v1);
  **     CREATE TABLE t2(ipk INTEGER PRIMARY KEY, v2);
  **     CREATE TABLE t3(ipk INTEGER PRIMARY KEY, v3);
  **
  ** then table t2 can be omitted from the following:
  **
  **     SELECT v1, v3 FROM t1 
  **       LEFT JOIN t2 USING (t1.ipk=t2.ipk)
  **       LEFT JOIN t3 USING (t1.ipk=t3.ipk)
  **
  ** or from:
  **
  **     SELECT DISTINCT v1, v3 FROM t1 
  **       LEFT JOIN t2
  **       LEFT JOIN t3 USING (t1.ipk=t3.ipk)
  */
  notReady = ~(Bitmask)0;
  if( pWInfo->nLevel>=2
   && pResultSet!=0               /* guarantees condition (1) above */
   && OptimizationEnabled(db, SQLITE_OmitNoopJoin)
  ){
    int i;
    Bitmask tabUsed = sqlite3WhereExprListUsage(pMaskSet, pResultSet);
    if( sWLB.pOrderBy ){
      tabUsed |= sqlite3WhereExprListUsage(pMaskSet, sWLB.pOrderBy);
    }
    for(i=pWInfo->nLevel-1; i>=1; i--){
      WhereTerm *pTerm, *pEnd;
      struct SrcList_item *pItem;
      pLoop = pWInfo->a[i].pWLoop;
      pItem = &pWInfo->pTabList->a[pLoop->iTab];
      if( (pItem->fg.jointype & JT_LEFT)==0 ) continue;
      if( (wctrlFlags & WHERE_WANT_DISTINCT)==0
       && (pLoop->wsFlags & WHERE_ONEROW)==0
      ){
        continue;
      }
      if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
      pEnd = sWLB.pWC->a + sWLB.pWC->nTerm;
      for(pTerm=sWLB.pWC->a; pTerm<pEnd; pTerm++){
        if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
          if( !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
           || pTerm->pExpr->iRightJoinTable!=pItem->iCursor
          ){
            break;
          }
        }
      }
      if( pTerm<pEnd ) continue;
      WHERETRACE(0xffff, ("-> drop loop %c not used\n", pLoop->cId));
      notReady &= ~pLoop->maskSelf;
      for(pTerm=sWLB.pWC->a; pTerm<pEnd; pTerm++){
        if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
          pTerm->wtFlags |= TERM_CODED;
        }
      }
      if( i!=pWInfo->nLevel-1 ){
        int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
        memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
      }
      pWInfo->nLevel--;
      nTabList--;
    }
  }
  WHERETRACE(0xffff,("*** Optimizer Finished ***\n"));
  pWInfo->pParse->nQueryLoop += pWInfo->nRowOut;

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  **
  ** A one-pass approach can be used if the caller has requested one
  ** and either (a) the scan visits at most one row or (b) each
  ** of the following are true:
  **
  **   * the caller has indicated that a one-pass approach can be used
  **     with multiple rows (by setting WHERE_ONEPASS_MULTIROW), and
  **   * the table is not a virtual table, and
  **   * either the scan does not use the OR optimization or the caller
  **     is a DELETE operation (WHERE_DUPLICATES_OK is only specified
  **     for DELETE).
  **
  ** The last qualification is because an UPDATE statement uses
  ** WhereInfo.aiCurOnePass[1] to determine whether or not it really can
  ** use a one-pass approach, and this is not set accurately for scans
  ** that use the OR optimization.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 ){
    int wsFlags = pWInfo->a[0].pWLoop->wsFlags;
    int bOnerow = (wsFlags & WHERE_ONEROW)!=0;
    assert( !(wsFlags & WHERE_VIRTUALTABLE) || IsVirtual(pTabList->a[0].pTab) );
    if( bOnerow || (
        0!=(wctrlFlags & WHERE_ONEPASS_MULTIROW)
     && !IsVirtual(pTabList->a[0].pTab)
     && (0==(wsFlags & WHERE_MULTI_OR) || (wctrlFlags & WHERE_DUPLICATES_OK))
    )){
      pWInfo->eOnePass = bOnerow ? ONEPASS_SINGLE : ONEPASS_MULTI;
      if( HasRowid(pTabList->a[0].pTab) && (wsFlags & WHERE_IDX_ONLY) ){
        if( wctrlFlags & WHERE_ONEPASS_MULTIROW ){
          bFordelete = OPFLAG_FORDELETE;
        }
        pWInfo->a[0].pWLoop->wsFlags = (wsFlags & ~WHERE_IDX_ONLY);
      }
    }
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    pLoop = pLevel->pWLoop;
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0 ){
      int op = OP_OpenRead;
      if( pWInfo->eOnePass!=ONEPASS_OFF ){
        op = OP_OpenWrite;
        pWInfo->aiCurOnePass[0] = pTabItem->iCursor;
      };
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      assert( pTabItem->iCursor==pLevel->iTabCur );
      testcase( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol==BMS-1 );
      testcase( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol==BMS );
      if( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol<BMS && HasRowid(pTab) ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, -1, SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
#ifdef SQLITE_ENABLE_CURSOR_HINTS
      if( pLoop->u.btree.pIndex!=0 ){
        sqlite3VdbeChangeP5(v, OPFLAG_SEEKEQ|bFordelete);
      }else
#endif
      {
        sqlite3VdbeChangeP5(v, bFordelete);
      }
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
      sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, pTabItem->iCursor, 0, 0,
                            (const u8*)&pTabItem->colUsed, P4_INT64);
#endif
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
    if( pLoop->wsFlags & WHERE_INDEXED ){
      Index *pIx = pLoop->u.btree.pIndex;
      int iIndexCur;
      int op = OP_OpenRead;
      /* iAuxArg is always set to a positive value if ONEPASS is possible */
      assert( iAuxArg!=0 || (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 );
      if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIx)
       && (wctrlFlags & WHERE_OR_SUBCLAUSE)!=0
      ){
        /* This is one term of an OR-optimization using the PRIMARY KEY of a
        ** WITHOUT ROWID table.  No need for a separate index */
        iIndexCur = pLevel->iTabCur;
        op = 0;
      }else if( pWInfo->eOnePass!=ONEPASS_OFF ){
        Index *pJ = pTabItem->pTab->pIndex;
        iIndexCur = iAuxArg;
        assert( wctrlFlags & WHERE_ONEPASS_DESIRED );
        while( ALWAYS(pJ) && pJ!=pIx ){
          iIndexCur++;
          pJ = pJ->pNext;
        }
        op = OP_OpenWrite;
        pWInfo->aiCurOnePass[1] = iIndexCur;
      }else if( iAuxArg && (wctrlFlags & WHERE_OR_SUBCLAUSE)!=0 ){
        iIndexCur = iAuxArg;
        op = OP_ReopenIdx;
      }else{
        iIndexCur = pParse->nTab++;
      }
      pLevel->iIdxCur = iIndexCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      if( op ){
        sqlite3VdbeAddOp3(v, op, iIndexCur, pIx->tnum, iDb);
        sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        if( (pLoop->wsFlags & WHERE_CONSTRAINT)!=0
         && (pLoop->wsFlags & (WHERE_COLUMN_RANGE|WHERE_SKIPSCAN))==0
         && (pWInfo->wctrlFlags&WHERE_ORDERBY_MIN)==0
         && pWInfo->eDistinct!=WHERE_DISTINCT_ORDERED
        ){
          sqlite3VdbeChangeP5(v, OPFLAG_SEEKEQ); /* Hint to COMDB2 */
        }
        VdbeComment((v, "%s", pIx->zName));
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
        {
          u64 colUsed = 0;
          int ii, jj;
          for(ii=0; ii<pIx->nColumn; ii++){
            jj = pIx->aiColumn[ii];
            if( jj<0 ) continue;
            if( jj>63 ) jj = 63;
            if( (pTabItem->colUsed & MASKBIT(jj))==0 ) continue;
            colUsed |= ((u64)1)<<(ii<63 ? ii : 63);
          }
          sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, iIndexCur, 0, 0,
                                (u8*)&colUsed, P4_INT64);
        }
#endif /* SQLITE_ENABLE_COLUMN_USED_MASK */
      }
    }
    if( iDb>=0 ) sqlite3CodeVerifySchema(pParse, iDb);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  for(ii=0; ii<nTabList; ii++){
    int addrExplain;
    int wsFlags;
    pLevel = &pWInfo->a[ii];
    wsFlags = pLevel->pWLoop->wsFlags;
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 ){
      constructAutomaticIndex(pParse, &pWInfo->sWC,
                &pTabList->a[pLevel->iFrom], notReady, pLevel);
      if( db->mallocFailed ) goto whereBeginError;
    }
#endif
    addrExplain = sqlite3WhereExplainOneScan(
        pParse, pTabList, pLevel, wctrlFlags
    );
    pLevel->addrBody = sqlite3VdbeCurrentAddr(v);
    notReady = sqlite3WhereCodeOneLoopStart(pParse,v,pWInfo,ii,pLevel,notReady);
    pWInfo->iContinue = pLevel->addrCont;
    if( (wsFlags&WHERE_MULTI_OR)==0 && (wctrlFlags&WHERE_OR_SUBCLAUSE)==0 ){
      sqlite3WhereAddScanStatus(v, pTabList, pLevel, addrExplain);
    }
  }

  /* Done. */
  VdbeModuleComment((v, "Begin WHERE-core"));
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}